

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# density_test_common.h
# Opt level: O2

string * __thiscall
density_tests::
truncated_type_name<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
          (string *__return_storage_ptr__,density_tests *this,size_t i_max_size)

{
  char *__ptr;
  char *pcVar1;
  int status;
  allocator local_2d;
  int local_2c;
  
  local_2c = 0;
  __ptr = (char *)__cxa_demangle("N7density14lf_heter_queueIN13density_tests15TestRuntimeTimeINS_12runtime_typeIJNS_12feature_listIJNS_6f_sizeENS_11f_alignmentENS_16f_copy_constructENS_16f_move_constructENS_6f_rttiENS_9f_destroyEEEEEEEEENS1_17DeepTestAllocatorILm65536EEELNS_23concurrency_cardinalityE1ELSG_1ELNS_17consistency_modelE1EEE"
                                 ,0,0,&local_2c);
  pcVar1 = 
  "N7density14lf_heter_queueIN13density_tests15TestRuntimeTimeINS_12runtime_typeIJNS_12feature_listIJNS_6f_sizeENS_11f_alignmentENS_16f_copy_constructENS_16f_move_constructENS_6f_rttiENS_9f_destroyEEEEEEEEENS1_17DeepTestAllocatorILm65536EEELNS_23concurrency_cardinalityE1ELSG_1ELNS_17consistency_modelE1EEE"
  ;
  if (local_2c == 0) {
    pcVar1 = __ptr;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_2d);
  if (this < (density_tests *)__return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string truncated_type_name(size_t i_max_size = 80)
    {
#if defined(__GNUC__) && !defined(_MSC_VER)
        int         status    = 0;
        auto const  demangled = abi::__cxa_demangle(typeid(TYPE).name(), 0, 0, &status);
        std::string name      = status == 0 ? demangled : typeid(TYPE).name();
#else
        std::string name = typeid(TYPE).name();
#endif

        if (name.size() > i_max_size)
            name.resize(i_max_size);

#if defined(__GNUC__) && !defined(_MSC_VER)
        free(demangled);
#endif
        return name;
    }